

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::WeightParams::_InternalSerialize
          (WeightParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  LogMessage *other;
  ulong uVar4;
  string *psVar5;
  uint size;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (0 < (this->floatvalue_).current_size_) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar1 = (this->floatvalue_).current_size_;
    if (stream->end_ <= puVar3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    *puVar3 = '\n';
    puVar3 = puVar3 + 2;
    size = iVar1 << 2;
    for (uVar2 = size; 0x7f < uVar2; uVar2 = uVar2 >> 7) {
      puVar3[-1] = (byte)uVar2 | 0x80;
      puVar3 = puVar3 + 1;
    }
    puVar3[-1] = (byte)uVar2;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,(this->floatvalue_).arena_or_elements_,size,puVar3);
  }
  psVar5 = (string *)((ulong)(this->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar5->_M_string_length != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,psVar5,target);
  }
  psVar5 = (string *)((ulong)(this->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar5->_M_string_length != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x1e,psVar5,target);
  }
  psVar5 = (string *)((ulong)(this->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar5->_M_string_length != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x1f,psVar5,target);
  }
  if ((this != (WeightParams *)_WeightParams_default_instance_) &&
     (this->quantization_ != (QuantizationParams *)0x0)) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::QuantizationParams>
                       (0x28,this->quantization_,puVar3,stream);
  }
  if (this->isupdatable_ == true) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0x32,this->isupdatable_,puVar3);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,*(void **)(uVar4 + 8),*(int *)(uVar4 + 0x10),target);
  }
  return target;
}

Assistant:

uint8_t* WeightParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.WeightParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float floatValue = 1;
  if (this->_internal_floatvalue_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_floatvalue(), target);
  }

  // bytes float16Value = 2;
  if (!this->_internal_float16value().empty()) {
    target = stream->WriteBytesMaybeAliased(
        2, this->_internal_float16value(), target);
  }

  // bytes rawValue = 30;
  if (!this->_internal_rawvalue().empty()) {
    target = stream->WriteBytesMaybeAliased(
        30, this->_internal_rawvalue(), target);
  }

  // bytes int8RawValue = 31;
  if (!this->_internal_int8rawvalue().empty()) {
    target = stream->WriteBytesMaybeAliased(
        31, this->_internal_int8rawvalue(), target);
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->_internal_has_quantization()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        40, _Internal::quantization(this), target, stream);
  }

  // bool isUpdatable = 50;
  if (this->_internal_isupdatable() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(50, this->_internal_isupdatable(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.WeightParams)
  return target;
}